

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O0

int st__foreach(st__table *table,_func_st__retval_char_ptr_char_ptr_char_ptr *func,char *arg)

{
  st__retval sVar1;
  int local_40;
  int i;
  st__retval retval;
  st__table_entry **last;
  st__table_entry *ptr;
  char *arg_local;
  _func_st__retval_char_ptr_char_ptr_char_ptr *func_local;
  st__table *table_local;
  
  local_40 = 0;
  do {
    if (table->num_bins <= local_40) {
      return 1;
    }
    _i = table->bins + local_40;
    last = (st__table_entry **)*_i;
    while (last != (st__table_entry **)0x0) {
      sVar1 = (*func)((char *)*last,(char *)last[1],arg);
      if (sVar1 == st__CONTINUE) {
        _i = last + 2;
        last = (st__table_entry **)*_i;
      }
      else {
        if (sVar1 == st__STOP) {
          return 0;
        }
        if (sVar1 == st__DELETE) {
          *_i = last[2];
          table->num_entries = table->num_entries + -1;
          if (last != (st__table_entry **)0x0) {
            free(last);
          }
          last = (st__table_entry **)*_i;
        }
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

int
 st__foreach( st__table *table, enum st__retval (*func)(char *, char *, char *), char *arg)
{
    st__table_entry *ptr, **last;
    enum st__retval retval;
    int i;

    for(i = 0; i < table->num_bins; i++) {
    last = &table->bins[i]; ptr = *last;
    while (ptr != NULL) {
        retval = (*func)(ptr->key, ptr->record, arg);
        switch (retval) {
        case st__CONTINUE:
        last = &ptr->next; ptr = *last;
        break;
        case st__STOP:
        return 0;
        case st__DELETE:
        *last = ptr->next;
        table->num_entries--;   /* cstevens@ic */
        ABC_FREE(ptr);
        ptr = *last;
        }
    }
    }
    return 1;
}